

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

char * Extra_FileNameGenericAppend(char *pBase,char *pSuffix)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  sVar1 = strlen(pBase);
  sVar2 = strlen(pSuffix);
  if (sVar2 + sVar1 < 1000) {
    strcpy(Extra_FileNameGenericAppend::Buffer,pBase);
    pcVar3 = strrchr(Extra_FileNameGenericAppend::Buffer,0x2e);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    pcVar3 = strcat(Extra_FileNameGenericAppend::Buffer,pSuffix);
    return pcVar3;
  }
  __assert_fail("strlen(pBase) + strlen(pSuffix) < 1000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilFile.c"
                ,0xbd,"char *Extra_FileNameGenericAppend(char *, char *)");
}

Assistant:

char * Extra_FileNameGenericAppend( char * pBase, char * pSuffix )
{
    static char Buffer[1000];
    char * pDot;
    assert( strlen(pBase) + strlen(pSuffix) < 1000 );
    strcpy( Buffer, pBase );
    if ( (pDot = strrchr( Buffer, '.' )) )
        *pDot = 0;
    strcat( Buffer, pSuffix );
    return Buffer;
}